

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::PreciousBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  pointer ppCVar1;
  ChainstateManager *pCVar2;
  int iVar3;
  int iVar4;
  CBlockIndex *pCVar5;
  arith_uint256 *paVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  shared_ptr<const_CBlock> pblock;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar11;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  CBlockIndex *local_40;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &cs_main.super_recursive_mutex;
  local_38._M_owns = false;
  local_40 = pindex;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  iVar3 = base_uint<256U>::CompareTo
                    (&(local_40->nChainWork).super_base_uint<256U>,
                     &((this->m_chain).vChain.
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>);
  if (iVar3 < 0) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  }
  else {
    iVar4 = base_uint<256U>::CompareTo
                      (&((this->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>,
                       &(this->m_chainman->nLastPreciousChainwork).super_base_uint<256U>);
    if (0 < iVar4) {
      this->m_chainman->nBlockReverseSequenceId = -1;
    }
    ppCVar1 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar5 = (CBlockIndex *)0x0;
    }
    else {
      pCVar5 = ppCVar1[-1];
    }
    paVar6 = &this->m_chainman->nLastPreciousChainwork;
    if (paVar6 != &pCVar5->nChainWork) {
      lVar8 = 0;
      do {
        (paVar6->super_base_uint<256U>).pn[lVar8] =
             (pCVar5->nChainWork).super_base_uint<256U>.pn[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
    }
    this_00 = &this->setBlockIndexCandidates;
    pVar11 = std::
             _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
             ::equal_range(&this_00->_M_t,&local_40);
    std::
    _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
    pCVar2 = this->m_chainman;
    iVar4 = pCVar2->nBlockReverseSequenceId;
    local_40->nSequenceId = iVar4;
    pCVar2->nBlockReverseSequenceId = iVar4 + -1;
    bVar10 = (local_40->nStatus & 0x60) != 0;
    bVar9 = (local_40->nStatus & 7) < 3;
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(bVar9 || bVar10);
    if ((!bVar9 && !bVar10) && (local_40->m_chain_tx_count != 0)) {
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                  *)this_00,&local_40);
      PruneBlockIndexCandidates(this);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
    if (-1 < iVar3) {
      local_58._0_4_ = 0;
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_58;
      bVar9 = ActivateBestChain(this,state,pblock);
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
      goto LAB_00b0ffd0;
    }
  }
  bVar9 = true;
LAB_00b0ffd0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool Chainstate::PreciousBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);
    {
        LOCK(cs_main);
        if (pindex->nChainWork < m_chain.Tip()->nChainWork) {
            // Nothing to do, this block is not at the tip.
            return true;
        }
        if (m_chain.Tip()->nChainWork > m_chainman.nLastPreciousChainwork) {
            // The chain has been extended since the last call, reset the counter.
            m_chainman.nBlockReverseSequenceId = -1;
        }
        m_chainman.nLastPreciousChainwork = m_chain.Tip()->nChainWork;
        setBlockIndexCandidates.erase(pindex);
        pindex->nSequenceId = m_chainman.nBlockReverseSequenceId;
        if (m_chainman.nBlockReverseSequenceId > std::numeric_limits<int32_t>::min()) {
            // We can't keep reducing the counter if somebody really wants to
            // call preciousblock 2**31-1 times on the same set of tips...
            m_chainman.nBlockReverseSequenceId--;
        }
        if (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) && pindex->HaveNumChainTxs()) {
            setBlockIndexCandidates.insert(pindex);
            PruneBlockIndexCandidates();
        }
    }

    return ActivateBestChain(state, std::shared_ptr<const CBlock>());
}